

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O3

void load_histograms(void)

{
  int iVar1;
  
  if (raw_histogram != (hdr_histogram *)0x0) {
    free(raw_histogram);
  }
  hdr_init(1,3600000000,3,&raw_histogram);
  if (cor_histogram != (hdr_histogram *)0x0) {
    free(cor_histogram);
  }
  hdr_init(1,3600000000,3,&cor_histogram);
  if (scaled_raw_histogram != (hdr_histogram *)0x0) {
    free(scaled_raw_histogram);
  }
  hdr_init(1000,0x1ad27480000,3,&scaled_raw_histogram);
  if (scaled_cor_histogram != (hdr_histogram *)0x0) {
    free(scaled_cor_histogram);
  }
  hdr_init(1000,0x1ad27480000,3,&scaled_cor_histogram);
  iVar1 = 10000;
  do {
    hdr_record_value_atomic(raw_histogram,1000);
    hdr_record_corrected_value_atomic(cor_histogram,1000,10000);
    hdr_record_value_atomic(scaled_raw_histogram,0x7d000);
    hdr_record_corrected_value_atomic(scaled_cor_histogram,0x7d000,0x4e2000);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  hdr_record_value_atomic(raw_histogram,100000000);
  hdr_record_corrected_value_atomic(cor_histogram,100000000,10000);
  hdr_record_value_atomic(scaled_raw_histogram,51200000000);
  hdr_record_corrected_value_atomic(scaled_cor_histogram,51200000000,0x4e2000);
  return;
}

Assistant:

static void load_histograms(void)
{
    const int64_t highest_trackable_value = INT64_C(3600) * 1000 * 1000;
    const int32_t significant_figures = 3;
    const int64_t interval = INT64_C(10000);
    const int64_t scale = 512;
    const int64_t scaled_interval = interval * scale;

    int i;
    if (raw_histogram)
    {
        free(raw_histogram);
    }

    hdr_init(1, highest_trackable_value, significant_figures, &raw_histogram);

    if (cor_histogram)
    {
        free(cor_histogram);
    }

    hdr_init(1, highest_trackable_value, significant_figures, &cor_histogram);

    if (scaled_raw_histogram)
    {
        free(scaled_raw_histogram);
    }

    hdr_init(1000, highest_trackable_value * 512, significant_figures, &scaled_raw_histogram);

    if (scaled_cor_histogram)
    {
        free(scaled_cor_histogram);
    }

    hdr_init(1000, highest_trackable_value * 512, significant_figures, &scaled_cor_histogram);

    for (i = 0; i < 10000; i++)
    {
        hdr_record_value_atomic(raw_histogram, 1000);
        hdr_record_corrected_value_atomic(cor_histogram, 1000, interval);

        hdr_record_value_atomic(scaled_raw_histogram, 1000 * scale);
        hdr_record_corrected_value_atomic(scaled_cor_histogram, 1000 * scale, scaled_interval);
    }

    hdr_record_value_atomic(raw_histogram, 100000000);
    hdr_record_corrected_value_atomic(cor_histogram, 100000000, 10000L);

    hdr_record_value_atomic(scaled_raw_histogram, 100000000 * scale);
    hdr_record_corrected_value_atomic(scaled_cor_histogram, 100000000 * scale, scaled_interval);
}